

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

string * __thiscall
cnn::PickNegLogSoftmax::as_string
          (string *__return_storage_ptr__,PickNegLogSoftmax *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  pointer pbVar1;
  pointer puVar2;
  ostream *poVar3;
  pointer puVar4;
  string sep;
  ostringstream s;
  char local_1d1;
  char *local_1d0;
  char *local_1c8;
  char local_1c0 [16];
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (this->pval == (uint *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"log_softmax(",0xc);
    pbVar1 = (arg_names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")_{",3);
    local_1d0 = local_1c0;
    local_1b0 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
    puVar4 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar4 != puVar2) {
      do {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1d0,(long)local_1c8);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__cxx11::string::_M_replace((ulong)&local_1d0,0,local_1c8,0x2dbe97);
        puVar4 = puVar4 + 1;
      } while (puVar4 != puVar2);
    }
    local_1d1 = '}';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d1,1);
    __return_storage_ptr__ = local_1b0;
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"log_softmax(",0xc);
    pbVar1 = (arg_names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")_{",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1d0,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string PickNegLogSoftmax::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  if(pval) {
    s << "log_softmax(" << arg_names[0] << ")_{" << *pval << '}';
  } else {
    s << "log_softmax(" << arg_names[0] << ")_{";
    string sep = "";
    for(auto v : *pvals) { s << sep << v; sep = ","; }
    s << '}';
  }
  return s.str();
}